

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::ClientContext::FetchResultInternal
          (ClientContext *this,ClientContextLock *lock,PendingQueryResult *pending)

{
  ClientContextLock *this_00;
  bool bVar1;
  byte bVar2;
  pointer pAVar3;
  type pPVar4;
  type pQVar5;
  long in_RCX;
  element_type *local_38;
  
  this_00 = lock + 0x4d;
  pAVar3 = unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
           ::operator->((unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
                         *)this_00);
  unique_ptr<duckdb::Executor,_std::default_delete<duckdb::Executor>,_true>::operator*
            (&pAVar3->executor);
  pAVar3 = unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
           ::operator->((unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
                         *)this_00);
  pPVar4 = shared_ptr<duckdb::PreparedStatementData,_true>::operator*(&pAVar3->prepared);
  bVar1 = (pPVar4->properties).allow_stream_result;
  bVar2 = *(byte *)(in_RCX + 0x160);
  Executor::GetResult((Executor *)&stack0xffffffffffffffc8);
  (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38;
  if ((bVar1 == false) || ((bVar2 & 1) == 0)) {
    CleanupInternal((ClientContext *)lock,(ClientContextLock *)pending,(BaseQueryResult *)local_38,
                    false);
  }
  else {
    pAVar3 = unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
             ::operator->((unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
                           *)this_00);
    pQVar5 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
             operator*((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                        *)this);
    pAVar3->open_result = &pQVar5->super_BaseQueryResult;
  }
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)this;
}

Assistant:

unique_ptr<QueryResult> ClientContext::FetchResultInternal(ClientContextLock &lock, PendingQueryResult &pending) {
	D_ASSERT(active_query);
	D_ASSERT(active_query->IsOpenResult(pending));
	D_ASSERT(active_query->prepared);
	auto &executor = GetExecutor();
	auto &prepared = *active_query->prepared;
	bool create_stream_result = prepared.properties.allow_stream_result && pending.allow_stream_result;
	unique_ptr<QueryResult> result;
	D_ASSERT(executor.HasResultCollector());
	// we have a result collector - fetch the result directly from the result collector
	result = executor.GetResult();
	if (!create_stream_result) {
		CleanupInternal(lock, result.get(), false);
	} else {
		active_query->SetOpenResult(*result);
	}
	return result;
}